

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_bfs.cpp
# Opt level: O3

void __thiscall
ParallelBFS::ParallelBFS(ParallelBFS *this,communicator *comm,NodeList *vertices,NodeList *edges)

{
  pointer piVar1;
  pointer piVar2;
  ParallelBFS *this_00;
  NodeList *this_01;
  NodeList *this_02;
  int iVar3;
  int iVar4;
  int iVar5;
  NodeId *pNVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  value_type_conflict *__val;
  int iVar13;
  long lVar14;
  NodeList all_description;
  NodeList first_edges;
  NodeList part_edges;
  NodeList first_vertices;
  NodeList part_vertices;
  allocator_type local_d5;
  int local_d4;
  ParallelBFS *local_d0;
  NodeList *local_c8;
  NodeList *local_c0;
  NodeList *local_b8;
  NodeList *local_b0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  this->comm = comm;
  local_c0 = &this->vertices;
  local_c8 = &this->edges;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  piVar1 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar2 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  local_d0 = this;
  local_b8 = edges;
  iVar3 = boost::mpi::communicator::size();
  uVar9 = (ulong)((long)piVar2 - (long)piVar1) >> 2;
  local_d4 = (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                  (long)iVar3);
  piVar1 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  piVar2 = (vertices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  iVar4 = boost::mpi::communicator::size();
  uVar9 = (ulong)((long)piVar2 - (long)piVar1) >> 2;
  iVar3 = boost::mpi::communicator::size();
  std::vector<int,_std::allocator<int>_>::vector(&local_48,(long)iVar3,(allocator_type *)&local_60);
  iVar3 = boost::mpi::communicator::size();
  std::vector<int,_std::allocator<int>_>::vector(&local_60,(long)iVar3,(allocator_type *)&local_78);
  iVar3 = boost::mpi::communicator::size();
  std::vector<int,_std::allocator<int>_>::vector(&local_78,(long)iVar3,(allocator_type *)&local_90);
  iVar3 = boost::mpi::communicator::size();
  std::vector<int,_std::allocator<int>_>::vector(&local_90,(long)iVar3,(allocator_type *)&local_a8);
  iVar3 = boost::mpi::communicator::size();
  local_b0 = vertices;
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,(long)(iVar3 << 2),&local_d5);
  lVar14 = 0;
  lVar11 = 0;
  iVar3 = 0;
  iVar12 = 0;
  while( true ) {
    iVar5 = boost::mpi::communicator::size();
    if (iVar5 <= lVar11) break;
    iVar7 = (uint)(lVar11 < (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 |
                                        uVar9 & 0xffffffff) % (long)iVar4)) + local_d4;
    iVar5 = iVar7 + iVar3;
    piVar1 = (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = (long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
    if (lVar10 == iVar5) {
      iVar8 = (int)((ulong)((long)(local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
    }
    else {
      iVar8 = piVar1[iVar5];
    }
    iVar13 = (int)lVar14;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [iVar13] = (int)lVar10;
    *(int *)((long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar14) = iVar3;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [iVar13 + 1] = iVar3;
    *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar14) = iVar7;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [iVar13 + 2] = iVar7;
    *(int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar14) = iVar8 - iVar12;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [iVar13 + 3] = iVar8 - iVar12;
    *(int *)((long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar14) = iVar12;
    lVar11 = lVar11 + 1;
    lVar14 = lVar14 + 4;
    iVar3 = iVar5;
    iVar12 = iVar8;
  }
  pNVar6 = (NodeId *)operator_new(0x10);
  this_02 = local_c0;
  this_01 = local_c8;
  this_00 = local_d0;
  pNVar6[0] = 0;
  pNVar6[1] = 0;
  pNVar6[2] = 0;
  pNVar6[3] = 0;
  boost::mpi::detail::scatter_impl<int>
            (comm,local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,pNVar6,4,0);
  this_00->vertex_total_count = *pNVar6;
  this_00->first_vertex = pNVar6[1];
  std::vector<int,_std::allocator<int>_>::resize(this_02,(long)pNVar6[2]);
  boost::mpi::scatterv<int>(comm,local_b0,&local_48,&local_60,this_02,0);
  std::vector<int,_std::allocator<int>_>::resize(this_01,(long)pNVar6[3]);
  boost::mpi::scatterv<int>(comm,local_b8,&local_78,&local_90,this_01,0);
  prepare(this_00);
  operator_delete(pNVar6);
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ParallelBFS::ParallelBFS(const mpi::communicator &comm,
                         const NodeList &vertices,
                         const NodeList &edges) :
    comm(comm) {
  NodeId part = (NodeId)vertices.size() / comm.size(),
      left_vertices = (NodeId)vertices.size() % comm.size(),
      first_vertex = 0, first_edge = 0;
  NodeList part_vertices((size_t)comm.size());
  NodeList first_vertices((size_t)comm.size());
  NodeList part_edges((size_t)comm.size());
  NodeList first_edges((size_t)comm.size());
  NodeList all_description((size_t)(comm.size() << 2));
  for (int i = 0; i < comm.size(); ++i) {
    NodeId this_part = part + (i < left_vertices);
    NodeId last_edge = first_vertex + this_part == vertices.size() ?
                      (NodeId)edges.size() :
                      vertices[first_vertex + this_part];
    all_description[(i<<2)] = (NodeId)vertices.size();
    all_description[(i<<2) + 1] = first_vertices[i] = first_vertex;
    all_description[(i<<2) + 2] = part_vertices[i] = this_part;
    all_description[(i<<2) + 3] = part_edges[i] = last_edge - first_edge;
    first_edges[i] = first_edge;
    first_edge = last_edge;
    first_vertex += this_part;
  }
  NodeList description(4);
  mpi::scatter(comm, all_description.data(), description.data(), 4, 0);
  this->vertex_total_count = description[0];
  this->first_vertex = description[1];
  this->vertices.resize((size_t)description[2]);
  mpi::scatterv(comm, vertices, part_vertices, first_vertices,
                this->vertices, 0);
  this->edges.resize((size_t)description[3]);
  mpi::scatterv(comm, edges, part_edges, first_edges,
                this->edges, 0);
  prepare();
}